

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tty.c
# Opt level: O3

void ttwindow(int top,int bot)

{
  long lVar1;
  undefined8 uVar2;
  
  lVar1 = *(long *)(*(long *)(_cur_term + 0x20) + 0x18);
  if ((lVar1 != 0) && ((tttop != top || (ttbot != bot)))) {
    uVar2 = tgoto(lVar1,bot,top);
    tputs(uVar2,nrow - ttrow,ttputc);
    ttrow = 1000;
    ttcol = 1000;
    tttop = top;
    ttbot = bot;
  }
  return;
}

Assistant:

void
ttwindow(int top, int bot)
{
	if (change_scroll_region && (tttop != top || ttbot != bot)) {
		putpad(tgoto(change_scroll_region, bot, top), nrow - ttrow);
		ttrow = HUGE;	/* Unknown.		 */
		ttcol = HUGE;
		tttop = top;	/* Remember region.	 */
		ttbot = bot;
	}
}